

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_server.cpp
# Opt level: O0

void ht_tcp_server_write(HT_TCPServer *server,char *buffer,size_t size)

{
  HT_Boolean HVar1;
  ulong local_28;
  size_t i;
  size_t size_local;
  char *buffer_local;
  HT_TCPServer *server_local;
  
  ht_mutex_lock(server->client_mutex);
  for (local_28 = 0; local_28 < (server->client_sock_fd).size; local_28 = local_28 + 1) {
    HVar1 = ht_tcp_server_write_to_socket
                      (server,(server->client_sock_fd).data[local_28],buffer,size);
    if (HVar1 == 0) {
      ht_bag_int_remove_nth(&server->client_sock_fd,local_28);
      local_28 = local_28 - 1;
    }
  }
  ht_mutex_unlock(server->client_mutex);
  return;
}

Assistant:

void
ht_tcp_server_write(HT_TCPServer* server, char* buffer, size_t size)
{
    size_t i;

    ht_mutex_lock(server->client_mutex);

    for (i = 0; i < ht_bag_size(server->client_sock_fd); i++)
    {
        if (!ht_tcp_server_write_to_socket(server, ht_bag_nth(server->client_sock_fd, i), buffer, size))
        {
            ht_bag_int_remove_nth(&server->client_sock_fd, i);
            i--;
        }
    }

    ht_mutex_unlock(server->client_mutex);
}